

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_keyboard_test.cc
# Opt level: O0

int main(void)

{
  int i;
  virtual_keyboard_handler vkey;
  io_service _io;
  uint in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  virtual_keyboard_handler *this;
  int local_538;
  allocator<char> local_521;
  io_context *in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffb3c;
  string *in_stack_fffffffffffffb40;
  io_service *in_stack_fffffffffffffb48;
  virtual_keyboard_handler *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb5c;
  virtual_keyboard_handler *in_stack_fffffffffffffb60;
  
  boost::asio::io_context::io_context(in_stack_fffffffffffffae0);
  this = (virtual_keyboard_handler *)&local_521;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffae0,"ccel_vkey",(allocator *)this);
  ccel::udev::virtual_keyboard_handler::virtual_keyboard_handler
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
             in_stack_fffffffffffffb3c);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffae0);
  std::allocator<char>::~allocator(&local_521);
  ccel::udev::virtual_keyboard_handler::set_click_time
            (this,in_stack_fffffffffffffabc,in_stack_fffffffffffffab8);
  for (local_538 = 0; local_538 < 100; local_538 = local_538 + 1) {
    ccel::udev::virtual_keyboard_handler::click(in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c)
    ;
  }
  ccel::udev::virtual_keyboard_handler::~virtual_keyboard_handler(this);
  boost::asio::io_context::~io_context((io_context *)0x12dcbd);
  return 0;
}

Assistant:

int main(){
  ccel::io_service _io;
  ccel::udev::virtual_keyboard_handler vkey(_io);
  vkey.set_click_time(233,20);
  for(auto i=0;i<100;i++){
  vkey.click(233);
  }
  return 0;

}